

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

void __thiscall wasm::BranchUtils::getExitingBranches::Scanner::~Scanner(Scanner *this)

{
  Scanner *this_local;
  
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)(this + 0xd8));
  PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::~PostWalker
            ((PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)this);
  return;
}

Assistant:

inline NameSet getExitingBranches(Expression* ast) {
  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    NameSet targets;

    void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          targets.erase(name);
        }
      });
      operateOnScopeNameUses(curr, [&](Name& name) { targets.insert(name); });
    }
  };
  Scanner scanner;
  scanner.walk(ast);
  // anything not erased is a branch out
  return scanner.targets;
}